

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::writePlotFile(Amr *this)

{
  ostringstream *poVar1;
  ostream *poVar2;
  string sStack_1b8;
  Print local_198;
  
  if ((anonymous_namespace)::plot_files_output == '\x01') {
    if (first_plotfile == '\x01') {
      first_plotfile = '\0';
      (**(code **)(*(long *)(((this->amr_level).
                              super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                  + 0x118))();
    }
    if (DAT_007de788 != 0) {
      Concatenate(&sStack_1b8,&this->plot_file_root,
                  *(this->level_steps).super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,this->file_name_digits);
      if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
        poVar2 = OutStream();
        Print::Print(&local_198,poVar2);
        poVar1 = &local_198.ss;
        std::operator<<((ostream *)poVar1,"PLOTFILE: file = ");
        std::operator<<((ostream *)poVar1,(string *)&sStack_1b8);
        std::operator<<((ostream *)poVar1,'\n');
        Print::~Print(&local_198);
      }
      if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
        poVar2 = std::operator<<((ostream *)&this->runlog,"PLOTFILE: file = ");
        poVar2 = std::operator<<(poVar2,(string *)&sStack_1b8);
        std::operator<<(poVar2,'\n');
      }
      writePlotFileDoit(this,&sStack_1b8,true);
      std::__cxx11::string::~string((string *)&sStack_1b8);
    }
  }
  return;
}

Assistant:

void
Amr::writePlotFile ()
{
    if ( ! Plot_Files_Output()) {
        return;
    }

    BL_PROFILE_REGION_START("Amr::writePlotFile()");
    BL_PROFILE("Amr::writePlotFile()");

    if (first_plotfile) {
        first_plotfile = false;
        amr_level[0]->setPlotVariables();
    }

    // Don't continue if we have no variables to plot.

    if (statePlotVars().size() == 0) {
        return;
    }

    const std::string& pltfile = amrex::Concatenate(plot_file_root,
                                                    level_steps[0],
                                                    file_name_digits);

    if (verbose > 0) {
        amrex::Print() << "PLOTFILE: file = " << pltfile << '\n';
    }

    if (record_run_info && ParallelDescriptor::IOProcessor()) {
        runlog << "PLOTFILE: file = " << pltfile << '\n';
    }

    writePlotFileDoit(pltfile, true);

    BL_PROFILE_REGION_STOP("Amr::writePlotFile()");
}